

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *parentpos,ChVector<double> *parentspeed,ChVector<double> *parentacc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChVector<double> localspeed;
  ChVector<double> localpos;
  ChVector<double> local_60;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  ChTransform<double>::TransformParentToLocal
            (parentpos,&(this->super_ChFrame<double>).coord.pos,
             &(this->super_ChFrame<double>).Amatrix);
  PointSpeedParentToLocal(&local_60,this,parentpos,parentspeed);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_48;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_40;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_38;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->coord_dtdt).rot.m_data[0];
  dVar1 = (this->coord_dtdt).rot.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar15 = ZEXT816(0) << 0x40;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_48 * dVar1;
  auVar8 = vfmsub231sd_fma(auVar37,auVar10,auVar15);
  dVar2 = (this->coord_dtdt).rot.m_data[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2;
  auVar8 = vfnmadd231sd_fma(auVar8,auVar19,auVar29);
  dVar3 = (this->coord_dtdt).rot.m_data[3];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar5 = vfnmadd231sd_fma(auVar8,auVar22,auVar27);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1 * 0.0;
  auVar8 = vfmadd231sd_fma(auVar39,auVar10,auVar30);
  auVar8 = vfnmadd231sd_fma(auVar8,auVar22,auVar29);
  auVar8 = vfmadd231sd_fma(auVar8,auVar19,auVar27);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2 * 0.0;
  auVar13 = vfmadd231sd_fma(auVar41,auVar10,auVar29);
  auVar13 = vfmadd231sd_fma(auVar13,auVar22,auVar30);
  auVar9 = vfnmadd231sd_fma(auVar13,auVar14,auVar27);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3 * 0.0;
  auVar13 = vfmadd231sd_fma(auVar43,auVar27,auVar10);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar30,auVar19);
  auVar13 = vfmadd231sd_fma(auVar13,auVar29,auVar14);
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar8._0_8_ * dVar1;
  auVar6 = vfnmadd231sd_fma(auVar46,auVar5,auVar17);
  auVar6 = vfmadd231sd_fma(auVar6,auVar13,auVar16);
  auVar6 = vfnmadd231sd_fma(auVar6,auVar9,auVar23);
  auVar7 = vmulsd_avx512f(auVar20,auVar9);
  auVar7 = vfnmadd231sd_avx512f(auVar7,auVar5,auVar16);
  auVar7 = vfnmadd231sd_avx512f(auVar7,auVar13,auVar17);
  auVar7 = vfmadd231sd_avx512f(auVar7,auVar8,auVar23);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar13._0_8_ * dVar1;
  auVar13 = vfnmadd231sd_fma(auVar44,auVar23,auVar5);
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar9);
  auVar5 = vfnmadd231sd_fma(auVar13,auVar16,auVar8);
  auVar8 = vaddsd_avx512f(auVar7,auVar7);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = parentacc->m_data[1] - (this->coord_dtdt).pos.m_data[1];
  auVar9 = vsubsd_avx512f(auVar32,auVar8);
  dVar2 = (this->coord_dt).rot.m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2;
  dVar3 = (this->coord_dt).rot.m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar3;
  auVar8 = vmulsd_avx512f(auVar30,auVar35);
  auVar8 = vfmsub231sd_avx512f(auVar8,auVar38,auVar15);
  dVar4 = (this->coord_dt).rot.m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar4;
  auVar8 = vfnmadd231sd_avx512f(auVar8,auVar40,auVar29);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = (this->coord_dt).rot.m_data[3];
  auVar7 = vfnmadd231sd_avx512f(auVar8,auVar42,auVar27);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3 * 0.0;
  auVar8 = vfmadd213sd_avx512f(auVar30,auVar38,auVar33);
  auVar8 = vfnmadd231sd_avx512f(auVar8,auVar42,auVar29);
  auVar10 = vfmadd231sd_avx512f(auVar8,auVar40,auVar27);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar4 * 0.0;
  auVar8 = vfmadd213sd_avx512f(auVar29,auVar38,auVar34);
  auVar8 = vfmadd231sd_avx512f(auVar8,auVar42,auVar30);
  auVar11 = vfnmadd231sd_avx512f(auVar8,auVar35,auVar27);
  auVar12 = vmulsd_avx512f(auVar42,auVar15);
  auVar8 = vfmadd213sd_avx512f(auVar27,auVar38,auVar12);
  auVar8 = vfnmadd231sd_fma(auVar8,auVar40,auVar30);
  auVar8 = vfmadd231sd_fma(auVar8,auVar35,auVar29);
  auVar13 = vmulsd_avx512f(auVar38,auVar10);
  auVar13 = vfnmadd231sd_avx512f(auVar13,auVar7,auVar35);
  auVar13 = vfmadd231sd_fma(auVar13,auVar8,auVar40);
  auVar14 = vfnmadd231sd_avx512f(auVar13,auVar11,auVar42);
  auVar13 = vmulsd_avx512f(auVar38,auVar11);
  auVar13 = vfnmadd231sd_avx512f(auVar13,auVar7,auVar40);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar8,auVar35);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar10,auVar42);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * auVar8._0_8_;
  auVar8 = vfnmadd231sd_avx512f(auVar28,auVar42,auVar7);
  auVar8 = vfmadd231sd_avx512f(auVar8,auVar35,auVar11);
  auVar7 = vfnmadd231sd_avx512f(auVar8,auVar40,auVar10);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar13._0_8_ + auVar13._0_8_;
  auVar10 = vsubsd_avx512f(auVar9,auVar31);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_60.m_data[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_60.m_data[1];
  auVar8 = vmulsd_avx512f(auVar45,auVar35);
  auVar8 = vfmsub231sd_avx512f(auVar8,auVar38,auVar15);
  auVar8 = vfnmadd231sd_avx512f(auVar8,auVar40,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_60.m_data[2];
  auVar13 = vfnmadd231sd_avx512f(auVar8,auVar42,auVar48);
  auVar8 = vfmadd231sd_fma(auVar33,auVar38,auVar45);
  auVar8 = vfnmadd231sd_fma(auVar8,auVar42,auVar47);
  auVar11 = vfmadd231sd_avx512f(auVar8,auVar40,auVar48);
  auVar8 = vfmadd231sd_fma(auVar34,auVar38,auVar47);
  auVar8 = vfmadd231sd_fma(auVar8,auVar45,auVar42);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_60.m_data[2];
  auVar15 = vfnmadd231sd_avx512f(auVar8,auVar35,auVar49);
  auVar8 = vfmadd213sd_avx512f(auVar49,auVar38,auVar12);
  auVar8 = vfnmadd231sd_avx512f(auVar8,auVar40,auVar45);
  auVar12 = vfmadd231sd_avx512f(auVar8,auVar35,auVar47);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar11._0_8_ * dVar1;
  auVar8 = vfnmadd231sd_avx512f(auVar25,auVar13,auVar17);
  auVar8 = vfmadd231sd_avx512f(auVar8,auVar12,auVar16);
  auVar9 = vfnmadd231sd_fma(auVar8,auVar15,auVar23);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar15._0_8_ * dVar1;
  auVar8 = vfnmadd231sd_avx512f(auVar36,auVar13,auVar16);
  auVar8 = vfnmadd231sd_avx512f(auVar8,auVar12,auVar17);
  auVar8 = vfmadd231sd_fma(auVar8,auVar11,auVar23);
  auVar12 = vmulsd_avx512f(auVar20,auVar12);
  auVar13 = vfnmadd231sd_avx512f(auVar12,auVar23,auVar13);
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar15);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar16,auVar11);
  dVar1 = (((parentacc->m_data[0] - (this->coord_dtdt).pos.m_data[0]) -
           (auVar6._0_8_ + auVar6._0_8_)) - (auVar14._0_8_ + auVar14._0_8_)) - auVar9._0_8_ * 4.0;
  dVar2 = auVar10._0_8_ - auVar8._0_8_ * 4.0;
  dVar3 = (((parentacc->m_data[2] - (this->coord_dtdt).pos.m_data[2]) -
           (auVar5._0_8_ + auVar5._0_8_)) - (auVar7._0_8_ + auVar7._0_8_)) - auVar13._0_8_ * 4.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x18);
  auVar8 = vfmadd231sd_fma(auVar21,auVar15,auVar8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar8 = vfmadd231sd_fma(auVar8,auVar11,auVar13);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar13 = vfmadd231sd_fma(auVar26,auVar15,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x38);
  auVar13 = vfmadd231sd_fma(auVar13,auVar11,auVar5);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x28);
  auVar6 = vfmadd231sd_fma(auVar24,auVar18,auVar9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar6 = vfmadd231sd_fma(auVar6,auVar12,auVar7);
  __return_storage_ptr__->m_data[0] = auVar8._0_8_;
  __return_storage_ptr__->m_data[1] = auVar13._0_8_;
  __return_storage_ptr__->m_data[2] = auVar6._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointAccelerationParentToLocal(const ChVector<Real>& parentpos,
                                                  const ChVector<Real>& parentspeed,
                                                  const ChVector<Real>& parentacc) const {
        ChVector<Real> localpos = ChFrame<Real>::TransformParentToLocal(parentpos);
        ChVector<Real> localspeed = PointSpeedParentToLocal(parentpos, parentspeed);
        return this->Amatrix.transpose() *
               (parentacc - coord_dtdt.pos -
                (coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2 -
                (coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2 -
                (coord_dt.rot % ChQuaternion<Real>(0, localspeed) % this->coord.rot.GetConjugate()).GetVector() * 4);
    }